

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O3

int run_test_threadpool_cancel_getaddrinfo(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  long extraout_RDX;
  long extraout_RDX_00;
  ulong uVar7;
  long extraout_RDX_01;
  ulong *extraout_RDX_02;
  uv_work_t *puVar8;
  uint uVar9;
  ulong *puVar10;
  ulong *in_R11;
  long lVar11;
  long *plVar12;
  long lVar13;
  uv_sem_t *puVar14;
  int64_t eval_b;
  int64_t eval_b_3;
  addrinfo hints;
  cancel_info ci;
  uv_getaddrinfo_t reqs [4];
  undefined1 auStack_2320 [120];
  undefined1 auStack_22a8 [2048];
  undefined8 uStack_1aa8;
  char *pcStack_1aa0;
  code *pcStack_1a98;
  long *plStack_1a90;
  uv_sem_t *puStack_1a88;
  undefined8 uStack_1a80;
  long lStack_1a78;
  code *pcStack_1a70;
  ulong uStack_1a60;
  ulong uStack_1a58;
  undefined1 auStack_1a50 [144];
  undefined1 auStack_19c0 [8];
  long lStack_19b8;
  long *plStack_19b0;
  code *pcStack_19a8;
  undefined8 uStack_1998;
  code *pcStack_1990;
  ulong uStack_1980;
  ulong uStack_1978;
  undefined1 auStack_1970 [16];
  long *plStack_1960;
  undefined8 uStack_1958;
  long alStack_1950 [15];
  long alStack_18d8 [165];
  undefined1 auStack_13b0 [1320];
  undefined1 auStack_e88 [1320];
  undefined1 auStack_960 [1336];
  code *pcStack_428;
  uv_work_t *puStack_420;
  undefined8 uStack_418;
  code *pcStack_410;
  undefined8 uStack_400;
  code *pcStack_3f8;
  undefined8 uStack_3f0;
  long lStack_3e8;
  char acStack_3e0 [72];
  undefined8 uStack_398;
  long local_350 [6];
  undefined1 *local_320;
  undefined8 local_318;
  undefined1 local_310 [120];
  undefined1 local_298 [160];
  undefined1 local_1f8 [160];
  undefined1 local_158 [160];
  undefined1 local_b8 [168];
  
  local_318 = 0xa000000004;
  local_320 = local_298;
  uVar5 = uv_default_loop();
  saturate_threadpool();
  iVar2 = uv_getaddrinfo(uVar5,local_298,getaddrinfo_cb,"fail",0,0);
  local_350[0] = (long)iVar2;
  if (local_350[0] == 0) {
    iVar2 = uv_getaddrinfo(uVar5,local_1f8,getaddrinfo_cb,0,"fail",0);
    local_350[0] = (long)iVar2;
    if (local_350[0] != 0) goto LAB_001d3abb;
    iVar2 = uv_getaddrinfo(uVar5,local_158,getaddrinfo_cb,"fail","fail",0);
    local_350[0] = (long)iVar2;
    if (local_350[0] != 0) goto LAB_001d3aca;
    iVar2 = uv_getaddrinfo(uVar5,local_b8,getaddrinfo_cb,"fail",0,local_350);
    if (iVar2 != 0) goto LAB_001d3ad9;
    iVar2 = uv_timer_init(uVar5,local_310);
    if (iVar2 != 0) goto LAB_001d3ae8;
    iVar2 = uv_timer_start(local_310,timer_cb,10,0);
    if (iVar2 != 0) goto LAB_001d3af7;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_001d3b06;
    if (timer_cb_called == 1) {
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      iVar2 = uv_loop_close(uVar5);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d3b24;
    }
  }
  else {
    run_test_threadpool_cancel_getaddrinfo_cold_1();
LAB_001d3abb:
    run_test_threadpool_cancel_getaddrinfo_cold_2();
LAB_001d3aca:
    run_test_threadpool_cancel_getaddrinfo_cold_3();
LAB_001d3ad9:
    run_test_threadpool_cancel_getaddrinfo_cold_4();
LAB_001d3ae8:
    run_test_threadpool_cancel_getaddrinfo_cold_5();
LAB_001d3af7:
    run_test_threadpool_cancel_getaddrinfo_cold_6();
LAB_001d3b06:
    run_test_threadpool_cancel_getaddrinfo_cold_7();
  }
  run_test_threadpool_cancel_getaddrinfo_cold_8();
LAB_001d3b24:
  run_test_threadpool_cancel_getaddrinfo_cold_9();
  iVar2 = (int)&uStack_3f0;
  lVar11 = 0;
  pcStack_3f8 = (code *)0x1d3b64;
  uStack_398 = uVar5;
  snprintf(acStack_3e0,0x40,"UV_THREADPOOL_SIZE=%lu",4);
  pcStack_3f8 = (code *)0x1d3b6c;
  putenv(acStack_3e0);
  puVar8 = pause_reqs;
  pcStack_3f8 = (code *)0x1d3b78;
  uVar5 = uv_default_loop();
  while( true ) {
    pcStack_3f8 = (code *)0x1d3ba0;
    iVar3 = uv_sem_init((long)pause_sems + lVar11,0);
    lStack_3e8 = (long)iVar3;
    uStack_3f0 = 0;
    if (lStack_3e8 != 0) break;
    pcStack_3f8 = (code *)0x1d3bcb;
    iVar3 = uv_queue_work(uVar5,puVar8,work_cb,done_cb);
    lStack_3e8 = (long)iVar3;
    uStack_3f0 = 0;
    if (lStack_3e8 != 0) {
      pcStack_3f8 = (code *)0x1d3c0d;
      saturate_threadpool_cold_2();
      break;
    }
    lVar11 = lVar11 + 0x20;
    puVar8 = puVar8 + 1;
    lStack_3e8 = 0;
    if (lVar11 == 0x80) {
      return iVar3;
    }
  }
  pcStack_3f8 = getaddrinfo_cb;
  saturate_threadpool_cold_1();
  pcStack_3f8 = (code *)(long)iVar2;
  uStack_400 = 0xfffffffffffff445;
  if (pcStack_3f8 == (code *)0xfffffffffffff445) {
    lVar11 = extraout_RDX;
    if (extraout_RDX == 0) {
      iVar2 = uv_freeaddrinfo(0);
      return iVar2;
    }
  }
  else {
    pcStack_410 = (code *)0x1d3c5a;
    getaddrinfo_cb_cold_1();
    lVar11 = extraout_RDX_00;
  }
  pcStack_410 = timer_cb;
  getaddrinfo_cb_cold_2();
  pcStack_410 = (code *)0x80;
  uVar4 = *(uint *)(lVar11 + -8);
  puStack_420 = puVar8;
  uStack_418 = uVar5;
  if (uVar4 == 0) {
LAB_001d3cad:
    lVar13 = 0;
    pcStack_428 = (code *)0x1d3cba;
    uv_close(lVar11,0);
    do {
      pcStack_428 = (code *)0x1d3cca;
      iVar2 = uv_sem_post((long)pause_sems + lVar13);
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x80);
    timer_cb_called = timer_cb_called + 1;
    return iVar2;
  }
  uVar9 = 0;
  plVar12 = (long *)0x1ab81de;
LAB_001d3c78:
  puVar6 = *(undefined1 **)(lVar11 + -0x10);
  uVar7 = (ulong)(*(int *)(lVar11 + -4) * uVar9);
  if (*(int *)(puVar6 + uVar7 + 0x10) == 6) {
    uVar1 = *(uint *)(puVar6 + uVar7 + 0x48);
    puVar6 = (undefined1 *)(ulong)uVar1;
    if ((0x18 < uVar1) || ((0x1ab81deU >> (uVar1 & 0x1f) & 1) == 0)) goto LAB_001d3c9b;
  }
  else {
LAB_001d3c9b:
    pcStack_428 = (code *)0x1d3ca0;
    iVar2 = uv_cancel();
    if (iVar2 != 0) {
      pcStack_428 = run_test_threadpool_cancel_getnameinfo;
      timer_cb_cold_1();
      pcStack_428 = (code *)0x1ab81de;
      pcStack_1990 = (code *)0x1d3d07;
      iVar2 = uv_ip4_addr("127.0.0.1",0x50,auStack_1970);
      alStack_18d8[0] = (long)iVar2;
      plStack_1960 = (long *)0x0;
      if (alStack_18d8[0] == 0) {
        plVar12 = alStack_18d8;
        uStack_1958 = 0x52800000004;
        pcStack_1990 = (code *)0x1d3d4e;
        plStack_1960 = plVar12;
        lVar11 = uv_default_loop();
        pcStack_1990 = (code *)0x1d3d56;
        saturate_threadpool();
        puVar6 = auStack_1970;
        pcStack_1990 = (code *)0x1d3d70;
        iVar2 = uv_getnameinfo(lVar11,plVar12,getnameinfo_cb,puVar6,0);
        uStack_1978 = (ulong)iVar2;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3f68;
        puVar6 = auStack_1970;
        pcStack_1990 = (code *)0x1d3daf;
        iVar2 = uv_getnameinfo(lVar11,auStack_13b0,getnameinfo_cb,puVar6,0);
        uStack_1978 = (ulong)iVar2;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3f77;
        puVar6 = auStack_1970;
        pcStack_1990 = (code *)0x1d3dee;
        iVar2 = uv_getnameinfo(lVar11,auStack_e88,getnameinfo_cb,puVar6,0);
        uStack_1978 = (ulong)iVar2;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3f86;
        puVar6 = auStack_1970;
        pcStack_1990 = (code *)0x1d3e2d;
        iVar2 = uv_getnameinfo(lVar11,auStack_960,getnameinfo_cb,puVar6,0);
        uStack_1978 = (ulong)iVar2;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3f95;
        plVar12 = alStack_1950;
        pcStack_1990 = (code *)0x1d3e5d;
        iVar2 = uv_timer_init(lVar11,plVar12);
        uStack_1978 = (ulong)iVar2;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3fa4;
        puVar6 = (undefined1 *)0x0;
        pcStack_1990 = (code *)0x1d3e93;
        iVar2 = uv_timer_start(plVar12,timer_cb,10);
        uStack_1978 = (ulong)iVar2;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3fb3;
        pcStack_1990 = (code *)0x1d3ebd;
        iVar2 = uv_run(lVar11,0);
        uStack_1978 = (ulong)iVar2;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3fc2;
        uStack_1978 = 1;
        uStack_1980 = (ulong)timer_cb_called;
        if (uStack_1980 != 1) goto LAB_001d3fd1;
        pcStack_1990 = (code *)0x1d3f12;
        uv_walk(lVar11,close_walk_cb,0);
        pcStack_1990 = (code *)0x1d3f1c;
        uv_run(lVar11,0);
        uStack_1978 = 0;
        pcStack_1990 = (code *)0x1d3f2d;
        iVar2 = uv_loop_close(lVar11);
        uStack_1980 = (ulong)iVar2;
        if (uStack_1978 == uStack_1980) {
          pcStack_1990 = (code *)0x1d3f49;
          uv_library_shutdown();
          return 0;
        }
      }
      else {
        pcStack_1990 = (code *)0x1d3f68;
        run_test_threadpool_cancel_getnameinfo_cold_1();
LAB_001d3f68:
        pcStack_1990 = (code *)0x1d3f77;
        run_test_threadpool_cancel_getnameinfo_cold_2();
LAB_001d3f77:
        pcStack_1990 = (code *)0x1d3f86;
        run_test_threadpool_cancel_getnameinfo_cold_3();
LAB_001d3f86:
        pcStack_1990 = (code *)0x1d3f95;
        run_test_threadpool_cancel_getnameinfo_cold_4();
LAB_001d3f95:
        pcStack_1990 = (code *)0x1d3fa4;
        run_test_threadpool_cancel_getnameinfo_cold_5();
LAB_001d3fa4:
        pcStack_1990 = (code *)0x1d3fb3;
        run_test_threadpool_cancel_getnameinfo_cold_6();
LAB_001d3fb3:
        pcStack_1990 = (code *)0x1d3fc2;
        run_test_threadpool_cancel_getnameinfo_cold_7();
LAB_001d3fc2:
        pcStack_1990 = (code *)0x1d3fd1;
        run_test_threadpool_cancel_getnameinfo_cold_8();
LAB_001d3fd1:
        pcStack_1990 = (code *)0x1d3fe0;
        run_test_threadpool_cancel_getnameinfo_cold_9();
      }
      iVar2 = (int)&uStack_1980;
      pcStack_1990 = getnameinfo_cb;
      run_test_threadpool_cancel_getnameinfo_cold_10();
      pcStack_1990 = (code *)(long)iVar2;
      uStack_1998 = 0xfffffffffffff445;
      if (pcStack_1990 == (code *)0xfffffffffffff445) {
        if (extraout_RDX_01 != 0) goto LAB_001d402e;
        if (puVar6 == (undefined1 *)0x0) {
          return iVar2;
        }
      }
      else {
        pcStack_19a8 = (code *)0x1d402e;
        getnameinfo_cb_cold_1();
LAB_001d402e:
        pcStack_19a8 = (code *)0x1d4036;
        getnameinfo_cb_cold_2();
      }
      pcStack_19a8 = run_test_threadpool_cancel_random;
      getnameinfo_cb_cold_3();
      pcStack_19a8 = work_cb;
      pcStack_1a70 = (code *)0x1d404f;
      lStack_19b8 = lVar11;
      plStack_19b0 = plVar12;
      saturate_threadpool();
      pcStack_1a70 = (code *)0x1d4054;
      uVar5 = uv_default_loop();
      lVar11 = 1;
      pcStack_1a70 = (code *)0x1d407b;
      iVar2 = uv_random(uVar5,auStack_1a50,auStack_19c0,1,0,nop_random_cb);
      uStack_1a58 = (ulong)iVar2;
      uStack_1a60 = 0;
      if (uStack_1a58 == 0) {
        pcStack_1a70 = (code *)0x1d40a5;
        iVar2 = uv_cancel(auStack_1a50);
        uStack_1a58 = (ulong)iVar2;
        uStack_1a60 = 0;
        if (uStack_1a58 != 0) goto LAB_001d41b9;
        uStack_1a58 = (ulong)done_cb_called;
        uStack_1a60 = 0;
        if (uStack_1a58 == 0) {
          lVar13 = 0;
          puVar14 = pause_sems;
          uStack_1a58 = 0;
          do {
            pcStack_1a70 = (code *)0x1d40fc;
            uv_sem_post((long)pause_sems + lVar13);
            lVar13 = lVar13 + 0x20;
          } while (lVar13 != 0x80);
          pcStack_1a70 = (code *)0x1d4113;
          iVar2 = uv_run(uVar5,0);
          uStack_1a58 = (ulong)iVar2;
          uStack_1a60 = 0;
          plVar12 = (long *)0x80;
          if (uStack_1a58 == 0) {
            uStack_1a58 = 1;
            uStack_1a60 = (ulong)done_cb_called;
            if (uStack_1a60 != 1) goto LAB_001d41e6;
            pcStack_1a70 = (code *)0x1d4168;
            uv_walk(uVar5,close_walk_cb,0);
            pcStack_1a70 = (code *)0x1d4172;
            uv_run(uVar5,0);
            uStack_1a58 = 0;
            pcStack_1a70 = (code *)0x1d4183;
            iVar2 = uv_loop_close(uVar5);
            uStack_1a60 = (ulong)iVar2;
            if (uStack_1a58 == uStack_1a60) {
              pcStack_1a70 = (code *)0x1d419b;
              uv_library_shutdown();
              return 0;
            }
          }
          else {
LAB_001d41d7:
            pcStack_1a70 = (code *)0x1d41e6;
            run_test_threadpool_cancel_random_cold_4();
LAB_001d41e6:
            pcStack_1a70 = (code *)0x1d41f5;
            run_test_threadpool_cancel_random_cold_5();
          }
          puVar10 = &uStack_1a58;
          iVar2 = (int)&uStack_1a60;
          pcStack_1a70 = nop_random_cb;
          run_test_threadpool_cancel_random_cold_6();
          lStack_1a78 = (long)iVar2;
          uStack_1a80 = 0xffffffffffffff83;
          pcStack_1a70 = (code *)uVar5;
          if (lStack_1a78 != -0x7d) {
            puStack_1a88 = (uv_sem_t *)0x1d4267;
            nop_random_cb_cold_1();
LAB_001d4267:
            plStack_1a90 = (long *)0x1e42c5;
            pcStack_1aa0 = "(void*) ri->buf";
            uStack_1aa8 = 0x1d42a7;
            puStack_1a88 = (uv_sem_t *)in_R11;
            fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
                    ,0xc1,"buf");
            puStack_1a88 = (uv_sem_t *)0x1d42b0;
            abort();
          }
          in_R11 = puVar10 + 0x12;
          if (in_R11 != extraout_RDX_02) goto LAB_001d4267;
          uStack_1a80 = 1;
          if (lVar11 == 1) {
            done_cb_called = done_cb_called + 1;
            return 1;
          }
          puStack_1a88 = (uv_sem_t *)run_test_threadpool_cancel_work;
          lStack_1a78 = lVar11;
          nop_random_cb_cold_2();
          pcStack_1a98 = done_cb;
          pcStack_1aa0 = (char *)uVar5;
          plStack_1a90 = plVar12;
          puStack_1a88 = puVar14;
          uVar5 = uv_default_loop();
          saturate_threadpool();
          lVar11 = 0;
          do {
            iVar2 = uv_queue_work(uVar5,auStack_22a8 + lVar11,work2_cb,done2_cb);
            if (iVar2 != 0) {
              run_test_threadpool_cancel_work_cold_1();
LAB_001d4487:
              run_test_threadpool_cancel_work_cold_2();
LAB_001d4496:
              run_test_threadpool_cancel_work_cold_3();
LAB_001d44a5:
              run_test_threadpool_cancel_work_cold_4();
LAB_001d44b4:
              run_test_threadpool_cancel_work_cold_5();
              goto LAB_001d44c3;
            }
            lVar11 = lVar11 + 0x80;
          } while (lVar11 != 0x800);
          iVar2 = uv_timer_init(uVar5,auStack_2320);
          if (iVar2 != 0) goto LAB_001d4487;
          iVar2 = uv_timer_start(auStack_2320,timer_cb,10,0);
          if (iVar2 != 0) goto LAB_001d4496;
          iVar2 = uv_run(uVar5,0);
          if (iVar2 != 0) goto LAB_001d44a5;
          if (timer_cb_called != 1) goto LAB_001d44b4;
          if (done2_cb_called == 0x10) {
            uv_walk(uVar5,close_walk_cb,0);
            uv_run(uVar5,0);
            iVar2 = uv_loop_close(uVar5);
            if (iVar2 == 0) {
              uv_library_shutdown();
              return 0;
            }
            goto LAB_001d44d2;
          }
LAB_001d44c3:
          run_test_threadpool_cancel_work_cold_6();
LAB_001d44d2:
          run_test_threadpool_cancel_work_cold_7();
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
                  ,0x99,"0 && \"work2_cb called\"");
          abort();
        }
      }
      else {
        pcStack_1a70 = (code *)0x1d41b9;
        run_test_threadpool_cancel_random_cold_1();
LAB_001d41b9:
        pcStack_1a70 = (code *)0x1d41c8;
        run_test_threadpool_cancel_random_cold_2();
      }
      pcStack_1a70 = (code *)0x1d41d7;
      run_test_threadpool_cancel_random_cold_3();
      puVar14 = (uv_sem_t *)work_cb;
      goto LAB_001d41d7;
    }
    uVar4 = *(uint *)(lVar11 + -8);
  }
  uVar9 = uVar9 + 1;
  if (uVar4 <= uVar9) goto LAB_001d3cad;
  goto LAB_001d3c78;
}

Assistant:

TEST_IMPL(threadpool_cancel_getaddrinfo) {
  uv_getaddrinfo_t reqs[4];
  struct cancel_info ci;
  struct addrinfo hints;
  uv_loop_t* loop;
  int r;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  r = uv_getaddrinfo(loop, reqs + 0, getaddrinfo_cb, "fail", NULL, NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 1, getaddrinfo_cb, NULL, "fail", NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 2, getaddrinfo_cb, "fail", "fail", NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 3, getaddrinfo_cb, "fail", NULL, &hints);
  ASSERT_OK(r);

  ASSERT_OK(uv_timer_init(loop, &ci.timer_handle));
  ASSERT_OK(uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, timer_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}